

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

ip_match_t * parse_match(char *str,ip_rule_t *ipr)

{
  int iVar1;
  ip_match_t *piVar2;
  void *pvVar3;
  int local_24;
  int i;
  ip_match_t *ipm;
  ip_rule_t *ipr_local;
  char *str_local;
  
  local_24 = 0;
  while( true ) {
    if (g_match_map[local_24].name == (char *)0x0) {
      return (ip_match_t *)0x0;
    }
    iVar1 = strcmp(str,g_match_map[local_24].name);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  piVar2 = (ip_match_t *)new(0x20);
  piVar2->map = g_match_map + local_24;
  pvVar3 = new(g_match_map[local_24].data_size);
  piVar2->data = pvVar3;
  list_add_tail(&piVar2->list,&ipr->matchs);
  return piVar2;
}

Assistant:

static ip_match_t *parse_match(char *str, ip_rule_t *ipr)
{
	ip_match_t *ipm = NULL;

	for (int i = 0; g_match_map[i].name != NULL; i++) {
		if (strcmp(str, g_match_map[i].name) == 0) {
			ipm = _new(ip_match_t);
			ipm->map = &g_match_map[i];
			ipm->data = new(g_match_map[i].data_size);
			list_add_tail(&ipm->list, &ipr->matchs);
			break;
		}
	}

	return ipm;
}